

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_doz(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGv_i64 pTVar1;
  TCGv_i64 arg1;
  uint32_t uVar2;
  TCGLabel *l;
  TCGLabel *l_00;
  TCGLabel *l2;
  TCGLabel *l1;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  s = ctx->uc->tcg_ctx;
  l = gen_new_label_ppc64(s);
  l_00 = gen_new_label_ppc64(s);
  uVar2 = rB(ctx->opcode);
  pTVar1 = cpu_gpr[uVar2];
  uVar2 = rA(ctx->opcode);
  tcg_gen_brcond_i64_ppc64(s,TCG_COND_GE,pTVar1,cpu_gpr[uVar2],l);
  uVar2 = rD(ctx->opcode);
  pTVar1 = cpu_gpr[uVar2];
  uVar2 = rB(ctx->opcode);
  arg1 = cpu_gpr[uVar2];
  uVar2 = rA(ctx->opcode);
  tcg_gen_sub_i64(s,pTVar1,arg1,cpu_gpr[uVar2]);
  tcg_gen_br(s,l_00);
  gen_set_label(s,l);
  uVar2 = rD(ctx->opcode);
  tcg_gen_movi_i64_ppc64(s,cpu_gpr[uVar2],0);
  gen_set_label(s,l_00);
  uVar2 = Rc(ctx->opcode);
  if (uVar2 != 0) {
    uVar2 = rD(ctx->opcode);
    gen_set_Rc0(ctx,cpu_gpr[uVar2]);
  }
  return;
}

Assistant:

static void gen_doz(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGLabel *l1 = gen_new_label(tcg_ctx);
    TCGLabel *l2 = gen_new_label(tcg_ctx);
    tcg_gen_brcond_tl(tcg_ctx, TCG_COND_GE, cpu_gpr[rB(ctx->opcode)],
                      cpu_gpr[rA(ctx->opcode)], l1);
    tcg_gen_sub_tl(tcg_ctx, cpu_gpr[rD(ctx->opcode)], cpu_gpr[rB(ctx->opcode)],
                   cpu_gpr[rA(ctx->opcode)]);
    tcg_gen_br(tcg_ctx, l2);
    gen_set_label(tcg_ctx, l1);
    tcg_gen_movi_tl(tcg_ctx, cpu_gpr[rD(ctx->opcode)], 0);
    gen_set_label(tcg_ctx, l2);
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, cpu_gpr[rD(ctx->opcode)]);
    }
}